

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall Parser::matchToken(Parser *this,TokenType type,bool optional)

{
  Tokenizer *this_00;
  Token *pTVar1;
  undefined3 in_register_00000011;
  bool bVar2;
  
  this_00 = (this->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer;
  if (CONCAT31(in_register_00000011,optional) == 0) {
    pTVar1 = Tokenizer::nextToken(this_00);
    bVar2 = pTVar1->type == type;
  }
  else {
    pTVar1 = Tokenizer::peekToken(this_00,0);
    bVar2 = true;
    if (pTVar1->type == type) {
      Tokenizer::eatTokens
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
    }
  }
  return bVar2;
}

Assistant:

bool Parser::matchToken(TokenType type, bool optional)
{
	if (optional)
	{
		const Token& token = peekToken();
		if (token.type == type)
			eatToken();
		return true;
	}
	
	return nextToken().type == type;
}